

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3GetInt32(char *zNum,int *pValue)

{
  char cVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  byte *pbVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  cVar1 = *zNum;
  if (cVar1 == '-') {
    lVar2 = -1;
    zNum = zNum + 1;
  }
  else {
    if (cVar1 == '0') {
      if (((byte)(zNum[1] | 0x20U) == 0x78) && ((""[(byte)zNum[2]] & 8) != 0)) {
        pbVar6 = (byte *)(zNum + 2);
        do {
          uVar4 = (ulong)*pbVar6;
          pbVar6 = pbVar6 + 1;
        } while (uVar4 == 0x30);
        bVar10 = true;
        uVar7 = 0;
        if ((""[uVar4] & 8) != 0) {
          uVar9 = 0;
          uVar7 = 0;
          do {
            uVar7 = (uint)(((char)((char)uVar4 * '\x02') >> 7 & 9U) + (char)uVar4 & 0xf) |
                    uVar7 << 4;
            uVar4 = (ulong)pbVar6[uVar9];
            if (6 < uVar9) break;
            uVar9 = uVar9 + 1;
          } while ((""[uVar4] & 8) != 0);
          bVar10 = (""[uVar4] & 8) == 0;
        }
        if ((int)uVar7 < 0) {
          return 0;
        }
        if (!bVar10) {
          return 0;
        }
        goto LAB_0013de69;
      }
    }
    else if (cVar1 == '+') {
      zNum = zNum + 1;
    }
    lVar2 = 0;
  }
  do {
    pcVar5 = zNum;
    zNum = pcVar5 + 1;
  } while (*pcVar5 == '0');
  lVar8 = -0xb;
  lVar3 = 0;
  while ((byte)(pcVar5[lVar8 + 0xb] - 0x30U) < 10) {
    lVar3 = (ulong)((byte)pcVar5[lVar8 + 0xb] & 0xf) + lVar3 * 10;
    lVar8 = lVar8 + 1;
    if (lVar8 == 0) {
      return 0;
    }
  }
  if (0x7fffffff < lVar2 + lVar3) {
    return 0;
  }
  uVar7 = -(uint)lVar3;
  if (cVar1 != '-') {
    uVar7 = (uint)lVar3;
  }
LAB_0013de69:
  *pValue = uVar7;
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetInt32(const char *zNum, int *pValue){
  sqlite_int64 v = 0;
  int i, c;
  int neg = 0;
  if( zNum[0]=='-' ){
    neg = 1;
    zNum++;
  }else if( zNum[0]=='+' ){
    zNum++;
  }
#ifndef SQLITE_OMIT_HEX_INTEGER
  else if( zNum[0]=='0'
        && (zNum[1]=='x' || zNum[1]=='X')
        && sqlite3Isxdigit(zNum[2])
  ){
    u32 u = 0;
    zNum += 2;
    while( zNum[0]=='0' ) zNum++;
    for(i=0; sqlite3Isxdigit(zNum[i]) && i<8; i++){
      u = u*16 + sqlite3HexToInt(zNum[i]);
    }
    if( (u&0x80000000)==0 && sqlite3Isxdigit(zNum[i])==0 ){
      memcpy(pValue, &u, 4);
      return 1;
    }else{
      return 0;
    }
  }
#endif
  while( zNum[0]=='0' ) zNum++;
  for(i=0; i<11 && (c = zNum[i] - '0')>=0 && c<=9; i++){
    v = v*10 + c;
  }

  /* The longest decimal representation of a 32 bit integer is 10 digits:
  **
  **             1234567890
  **     2^31 -> 2147483648
  */
  testcase( i==10 );
  if( i>10 ){
    return 0;
  }
  testcase( v-neg==2147483647 );
  if( v-neg>2147483647 ){
    return 0;
  }
  if( neg ){
    v = -v;
  }
  *pValue = (int)v;
  return 1;
}